

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

ushort __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::GetInteriorAddressIndex
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,void *interiorAddress)

{
  code *pcVar1;
  bool bVar2;
  ushort uVar3;
  BOOL BVar4;
  char *pcVar5;
  undefined4 *puVar6;
  ushort index;
  uint offset;
  void *interiorAddress_local;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  if ((this->super_HeapBlock).address <= interiorAddress) {
    pcVar5 = GetEndAddress(this);
    if (interiorAddress < pcVar5) goto LAB_0090387e;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                     ,0x246,
                     "(interiorAddress >= address && interiorAddress < this->GetEndAddress())",
                     "interiorAddress >= address && interiorAddress < this->GetEndAddress()");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 0;
LAB_0090387e:
  BVar4 = HeapInfo::IsAlignedAddress((this->super_HeapBlock).address);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x247,"(HeapInfo::IsAlignedAddress(address))",
                       "HeapInfo::IsAlignedAddress(address)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar3 = ValidPointers<MediumAllocationBlockAttributes>::GetInteriorAddressIndex
                    (&this->validPointers,
                     (uint)((int)interiorAddress - (int)(this->super_HeapBlock).address) >> 4);
  if ((uVar3 != 0xffff) && (0x7ff < uVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x24e,
                       "(index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit || index <= TBlockAttributes::MaxAddressBit)"
                       ,
                       "index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit || index <= TBlockAttributes::MaxAddressBit"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  return uVar3;
}

Assistant:

ushort
SmallHeapBlockT<TBlockAttributes>::GetInteriorAddressIndex(void * interiorAddress)
{
    Assert(interiorAddress >= address && interiorAddress < this->GetEndAddress());
    Assert(HeapInfo::IsAlignedAddress(address));

    unsigned int offset = (unsigned int)((char*)interiorAddress - address);
    offset = offset >> HeapConstants::ObjectAllocationShift;

    ushort index = validPointers.GetInteriorAddressIndex(offset);
    Assert(index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit ||
        index <= TBlockAttributes::MaxAddressBit);
    return index;
}